

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ifc.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Bitmap::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Bitmap *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  SingleMthdTest *pSVar2;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar3;
  result_type rVar4;
  MthdVtxXy *this_01;
  MthdIfcSize *pMVar5;
  Test *pTVar6;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_179;
  Test *local_178;
  Test *local_170;
  SingleMthdTest *local_168;
  MthdIfcSize *local_160;
  MthdVtxXy *local_158;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_150;
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [16];
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  string local_e8;
  string local_c8;
  string local_a8;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  SingleMthdTest *local_68;
  Test *local_60;
  Test *local_58;
  MthdVtxXy *local_50;
  MthdIfcSize *local_48;
  MthdIfcSize *local_40;
  Test *local_38;
  
  local_168 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_108 = local_f8;
  local_150 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"notify","");
  pSVar2 = local_168;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_168,opt,(uint32_t)rVar4);
  (pSVar2->super_MthdTest).trapbit = -1;
  (pSVar2->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar2->s_cls = uVar1;
  pSVar2->s_mthd = 0x104;
  pSVar2->s_stride = 4;
  pSVar2->s_num = 1;
  pSVar2->s_trapbit = -1;
  (pSVar2->name)._M_dataplus._M_p = (pointer)&(pSVar2->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar2->name,local_108,local_108 + local_100)
  ;
  (pSVar2->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_68 = pSVar2;
  local_170 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"color0","");
  pTVar6 = local_170;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_170,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_128,local_128 + local_120);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c7f8;
  local_60 = pTVar6;
  local_178 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"color1","");
  pTVar6 = local_178;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_178,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x30c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_148,local_148 + local_140);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c8f0;
  local_58 = pTVar6;
  this_01 = (MthdVtxXy *)operator_new(0x25958);
  local_158 = this_01;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"xy","");
  MthdVtxXy::MthdVtxXy
            (this_01,opt,(uint32_t)rVar4,&local_a8,-1,(this->super_Class).cls,0x310,1,4,0x21);
  local_50 = this_01;
  pMVar5 = (MthdIfcSize *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"size_out","");
  MthdIfcSize::MthdIfcSize
            (pMVar5,opt,(uint32_t)rVar4,&local_c8,-1,(this->super_Class).cls,0x314,0x14);
  local_48 = pMVar5;
  pMVar5 = (MthdIfcSize *)operator_new(0x25958);
  local_160 = pMVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"size_in","");
  MthdIfcSize::MthdIfcSize
            (pMVar5,opt,(uint32_t)rVar4,&local_e8,-1,(this->super_Class).cls,0x318,0x12);
  local_40 = pMVar5;
  pTVar6 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"bitmap_data","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 0x20;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_88,local_88 + local_80);
  pvVar3 = local_150;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034d108;
  *(undefined1 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 1;
  __l._M_len = 7;
  __l._M_array = &local_68;
  local_38 = pTVar6;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_150,__l,&local_179);
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  return pvVar3;
}

Assistant:

std::vector<SingleMthdTest *> Bitmap::mthds() {
	return {
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdBitmapColor0(opt, rnd(), "color0", -1, cls, 0x308),
		new MthdBitmapColor1(opt, rnd(), "color1", -1, cls, 0x30c),
		new MthdVtxXy(opt, rnd(), "xy", -1, cls, 0x310, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdIfcSize(opt, rnd(), "size_out", -1, cls, 0x314, IFC_OUT | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "size_in", -1, cls, 0x318, IFC_IN | IFC_BITMAP),
		new MthdBitmapData(opt, rnd(), "bitmap_data", -1, cls, 0x400, 0x20, 4, true),
	};
}